

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O2

void __thiscall TDiabloRoot::TDiabloRoot(TDiabloRoot *this)

{
  TFileTreeRoot::TFileTreeRoot(&this->super_TFileTreeRoot,0);
  (this->super_TFileTreeRoot).super_TRootHandler._vptr_TRootHandler =
       (_func_int **)&PTR__TDiabloRoot_0012e520;
  memset(this->RootFolders,0,0x724);
  this->pPackagesMap = (PCASC_MAP)0x0;
  this->pbPackagesDat = (LPBYTE)0x0;
  this->cbPackagesDat = 0;
  return;
}

Assistant:

TDiabloRoot() : TFileTreeRoot(0)
    {
        memset(RootFolders, 0, sizeof(RootFolders));
        pFileIndices = NULL;
        pbCoreTocFile = NULL;
        pbCoreTocData = NULL;
        nFileIndices = 0;
        cbCoreTocFile = 0;

        // Map for searching a real file extension
        pPackagesMap = NULL;
        pbPackagesDat = NULL;
        cbPackagesDat = 0;
    }